

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

QStyle * __thiscall QFormLayoutPrivate::getStyle(QFormLayoutPrivate *this)

{
  QWidget *this_00;
  QStyle *pQVar1;
  
  this_00 = QLayout::parentWidget(*(QLayout **)&(this->super_QLayoutPrivate).field_0x8);
  if (this_00 != (QWidget *)0x0) {
    pQVar1 = QWidget::style(this_00);
    return pQVar1;
  }
  pQVar1 = QApplication::style();
  return pQVar1;
}

Assistant:

QStyle* QFormLayoutPrivate::getStyle() const
{
    Q_Q(const QFormLayout);

    // ### cache
    if (QWidget *parentWidget = q->parentWidget())
        return parentWidget->style();
    else
        return QApplication::style();
}